

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAddRgEa<(moira::Instr)119,(moira::Mode)5,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ea<(moira::Mode)5,_2> dst;
  u32 local_34;
  ushort local_30;
  u32 local_2c;
  
  local_30 = op & 7;
  local_34 = *addr;
  local_2c = dasmIncRead<2>(this,addr);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar1,(Dn)(op >> 9 & 7));
  StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)5,_2> *)&local_34);
  return;
}

Assistant:

void
Moira::dasmAddRgEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}